

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequential_attribute_encoder.cc
# Opt level: O3

bool __thiscall
draco::SequentialAttributeEncoder::SetPredictionSchemeParentAttributes
          (SequentialAttributeEncoder *this,PredictionSchemeInterface *ps)

{
  PointCloud *this_00;
  int iVar1;
  Type type;
  int32_t parent_att_id;
  PointAttribute *pPVar2;
  uint uVar3;
  
  iVar1 = (*ps->_vptr_PredictionSchemeInterface[5])(ps);
  if (0 < iVar1) {
    uVar3 = 0;
    do {
      this_00 = this->encoder_->point_cloud_;
      type = (*ps->_vptr_PredictionSchemeInterface[6])(ps,(ulong)uVar3);
      parent_att_id = PointCloud::GetNamedAttributeId(this_00,type);
      if (parent_att_id == -1) {
        return false;
      }
      pPVar2 = PointCloudEncoder::GetPortableAttribute(this->encoder_,parent_att_id);
      iVar1 = (*ps->_vptr_PredictionSchemeInterface[7])(ps,pPVar2);
      if ((char)iVar1 == '\0') {
        return false;
      }
      uVar3 = uVar3 + 1;
      iVar1 = (*ps->_vptr_PredictionSchemeInterface[5])(ps);
    } while ((int)uVar3 < iVar1);
  }
  return true;
}

Assistant:

bool SequentialAttributeEncoder::SetPredictionSchemeParentAttributes(
    PredictionSchemeInterface *ps) {
  for (int i = 0; i < ps->GetNumParentAttributes(); ++i) {
    const int att_id = encoder_->point_cloud()->GetNamedAttributeId(
        ps->GetParentAttributeType(i));
    if (att_id == -1) {
      return false;  // Requested attribute does not exist.
    }
    if (!ps->SetParentAttribute(encoder_->GetPortableAttribute(att_id))) {
      return false;
    }
  }
  return true;
}